

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<unsigned_int,4>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  pointer ppVar6;
  reference pvVar7;
  size_t sVar8;
  PointAttribute *in_RDI;
  array<unsigned_int,_4UL> aVar9;
  __enable_if_t<is_constructible<value_type,_pair<array<unsigned_int,_4UL>,_IndexType<unsigned_int,_AttributeValueIndex_tag_type_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var10;
  PointIndex i_2;
  uint32_t i_1;
  bool inserted;
  iterator it;
  AttributeValueIndex att_pos;
  AttributeValueIndex i;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  AttributeHashableValue hashable_value;
  AttributeValue att_value;
  ValueToIndexMap value_to_index_map;
  AttributeValueIndex unique_vals;
  PointAttribute *in_stack_fffffffffffffe58;
  PointAttribute *in_stack_fffffffffffffe60;
  pair<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  *in_stack_fffffffffffffe68;
  unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  *in_stack_fffffffffffffe70;
  reference in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  _Node_iterator_base<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  in_stack_fffffffffffffe90;
  AttributeValueIndex att_index;
  uint local_130;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_12c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_128;
  uint local_124;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_120;
  uint local_11c;
  undefined4 local_118;
  uint local_114;
  _Node_iterator_base<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_100;
  undefined1 local_f8;
  pair<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  local_ec;
  _Node_iterator_base<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_d8;
  undefined1 local_d0;
  byte local_c1;
  uint local_b8;
  undefined1 local_b4 [16];
  uint local_a4;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_a0 [10];
  array<unsigned_int,_4UL> local_78;
  undefined1 local_68 [76];
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_1c [6];
  uint local_4;
  
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_1c,0);
  std::
  unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::unordered_map((unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                   *)0x1e9937);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                     *)in_stack_fffffffffffffe90._M_cur,
                    CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_a0,0);
  while( true ) {
    att_index.value_ = (uint)((ulong)in_stack_fffffffffffffe90._M_cur >> 0x20);
    bVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                      (local_a0,&in_RDI->num_unique_entries_);
    if (!bVar2) break;
    local_b8 = (uint)IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator+
                               ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                in_stack_fffffffffffffe58,
                                (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                0x1e9997);
    local_a4 = local_b8;
    aVar9 = GeometryAttribute::GetValue<unsigned_int,4>
                      ((GeometryAttribute *)
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),att_index);
    local_b4 = (undefined1  [16])aVar9;
    local_68._0_16_ = (undefined1  [16])aVar9;
    pvVar4 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)in_stack_fffffffffffffe60,
                        (size_type)in_stack_fffffffffffffe58);
    pvVar5 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)in_stack_fffffffffffffe60,
                        (size_type)in_stack_fffffffffffffe58);
    uVar1 = *(undefined8 *)(pvVar5 + 2);
    *(undefined8 *)pvVar4 = *(undefined8 *)pvVar5;
    *(undefined8 *)(pvVar4 + 2) = uVar1;
    std::__detail::
    _Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
    ::_Node_iterator((_Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                      *)0x1e9a48);
    std::
    pair<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
    ::
    pair<std::array<unsigned_int,_4UL>_&,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_&,_true>
              (&local_ec,&local_78,local_1c);
    _Var10 = std::
             unordered_map<std::array<unsigned_int,4ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,draco::HashArray<std::array<unsigned_int,4ul>>,std::equal_to<std::array<unsigned_int,4ul>>,std::allocator<std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>>
             ::
             insert<std::pair<std::array<unsigned_int,4ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                       (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe90._M_cur =
         (__node_type *)
         _Var10.first.
         super__Node_iterator_base<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
         ._M_cur;
    in_stack_fffffffffffffe8f = _Var10.second;
    local_100._M_cur = in_stack_fffffffffffffe90._M_cur;
    local_f8 = in_stack_fffffffffffffe8f;
    local_d8._M_cur = in_stack_fffffffffffffe90._M_cur;
    local_d0 = in_stack_fffffffffffffe8f;
    std::
    tie<std::__detail::_Node_iterator<std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,false,true>,bool>
              ((_Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                *)in_stack_fffffffffffffe68,(bool *)in_stack_fffffffffffffe60);
    std::
    tuple<std::__detail::_Node_iterator<std::pair<std::array<unsigned_int,4ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,false,true>&,bool&>
    ::operator=((tuple<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>_&,_bool_&>
                 *)in_stack_fffffffffffffe70,
                (pair<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>,_bool>
                 *)in_stack_fffffffffffffe68);
    if ((local_c1 & 1) == 0) {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                             *)0x1e9b0c);
      in_stack_fffffffffffffe80 =
           IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
           ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                         *)in_stack_fffffffffffffe60,
                        (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                        in_stack_fffffffffffffe58);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                (in_stack_fffffffffffffe80,&ppVar6->second);
    }
    else {
      local_114 = local_1c[0].value_;
      GeometryAttribute::SetAttributeValue
                ((GeometryAttribute *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffe90._M_cur >> 0x20),
                 in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe70 =
           (unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
            *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
              ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                            *)in_stack_fffffffffffffe60,
                           (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                           in_stack_fffffffffffffe58);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 in_stack_fffffffffffffe70,local_1c);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_1c);
    }
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_a0);
  }
  bVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator==
                    (local_1c,&in_RDI->num_unique_entries_);
  if (bVar2) {
    local_4 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
  }
  else {
    bVar2 = is_mapping_identity(in_RDI);
    if (bVar2) {
      SetExplicitMapping(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
      for (local_11c = 0; local_11c < in_RDI->num_unique_entries_; local_11c = local_11c + 1) {
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_120,local_11c);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                  (&local_128,local_11c);
        pvVar7 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                 ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                               *)in_stack_fffffffffffffe60,
                              (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                              in_stack_fffffffffffffe58);
        local_124 = pvVar7->value_;
        SetPointMapEntry(in_stack_fffffffffffffe58,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffe60);
      }
    }
    else {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_12c,0);
      while( true ) {
        sVar8 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                        *)0x1e9d2b);
        local_130 = (uint)sVar8;
        bVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<
                          (&local_12c,&local_130);
        if (!bVar2) break;
        in_stack_fffffffffffffe60 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffe60,
                          (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                          in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe58 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffe60,
                          (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                          in_stack_fffffffffffffe58);
        SetPointMapEntry(in_stack_fffffffffffffe58,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffe60);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_12c);
      }
    }
    uVar3 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
    in_RDI->num_unique_entries_ = uVar3;
    local_4 = in_RDI->num_unique_entries_;
  }
  local_118 = 1;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                      *)0x1e9de8);
  std::
  unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::~unordered_map((unordered_map<std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_int,_4UL>_>,_std::equal_to<std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_std::array<unsigned_int,_4UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                    *)0x1e9df5);
  return local_4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  typedef unordered_map<AttributeHashableValue, AttributeValueIndex,
                        HashArray<AttributeHashableValue>>
      ValueToIndexMap;

  // Hash map storing index of the first attribute with a given value.
  ValueToIndexMap value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    typename ValueToIndexMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = value_to_index_map.insert(
        std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                               unique_vals));

    // Try to update the hash map with a new entry pointing to the latest unique
    // vertex index.
    if (!inserted) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}